

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

void __thiscall
llm_graph_input_pos_bucket_kv::set_input(llm_graph_input_pos_bucket_kv *this,llama_ubatch *ubatch)

{
  uint uVar1;
  char cVar2;
  int32_t iVar3;
  ulong uVar4;
  char *pcVar5;
  int32_t *piVar6;
  int32_t *piVar7;
  long lVar8;
  ulong uVar9;
  undefined8 uStack_50;
  
  if (this->pos_bucket == (ggml_tensor *)0x0) {
    return;
  }
  uVar1 = ubatch->n_tokens;
  cVar2 = ggml_backend_buffer_is_host(this->pos_bucket->buffer);
  if (cVar2 == '\0') {
    pcVar5 = "ggml_backend_buffer_is_host(pos_bucket->buffer)";
    uStack_50 = 0x65;
  }
  else {
    if (ubatch->equal_seqs != true) {
      piVar6 = (int32_t *)this->pos_bucket->data;
      uVar4 = (ulong)this->kv_self->n;
      for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
        piVar7 = piVar6;
        for (lVar8 = 0; uVar4 << 4 != lVar8; lVar8 = lVar8 + 0x10) {
          iVar3 = llama_relative_position_bucket
                            ((&((this->kv_self->cells).
                                super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                                _M_impl.super__Vector_impl_data._M_start)->pos)[lVar8],
                             ubatch->pos[uVar9],(ulong)this->hparams->n_rel_attn_bkts,false);
          *piVar7 = iVar3;
          piVar7 = piVar7 + 1;
        }
        piVar6 = piVar6 + uVar4;
      }
      return;
    }
    pcVar5 = "!ubatch->equal_seqs";
    uStack_50 = 0x66;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
             ,uStack_50,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

void llm_graph_input_pos_bucket_kv::set_input(const llama_ubatch * ubatch) {
    if (pos_bucket) {
        const int64_t n_tokens = ubatch->n_tokens;

        GGML_ASSERT(ggml_backend_buffer_is_host(pos_bucket->buffer));
        GGML_ASSERT(!ubatch->equal_seqs); // TODO: use ubatch->n_seqs instead of failing

        int32_t * data = (int32_t *) pos_bucket->data;

        const int64_t n_kv = kv_self->n;

        for (int h = 0; h < 1; ++h) {
            for (int j = 0; j < n_tokens; ++j) {
                for (int i = 0; i < n_kv; ++i) {
                    data[h*(n_kv*n_tokens) + j*n_kv + i] = llama_relative_position_bucket(kv_self->cells[i].pos, ubatch->pos[j], hparams.n_rel_attn_bkts, false);
                }
            }
        }
    }
}